

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

ExtensionRange * __thiscall
google::protobuf::Descriptor::FindExtensionRangeContainingNumber(Descriptor *this,int number)

{
  ExtensionRange *pEVar1;
  long lVar2;
  
  lVar2 = (long)*(int *)(this + 0x68);
  if (0 < lVar2) {
    pEVar1 = *(ExtensionRange **)(this + 0x70);
    do {
      if ((pEVar1->start <= number) && (number < pEVar1->end)) {
        return pEVar1;
      }
      pEVar1 = pEVar1 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  return (ExtensionRange *)0x0;
}

Assistant:

const Descriptor::ExtensionRange*
Descriptor::FindExtensionRangeContainingNumber(int number) const {
  // Linear search should be fine because we don't expect a message to have
  // more than a couple extension ranges.
  for (int i = 0; i < extension_range_count(); i++) {
    if (number >= extension_range(i)->start &&
        number <  extension_range(i)->end) {
      return extension_range(i);
    }
  }
  return NULL;
}